

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_normal.c
# Opt level: O0

bool_t prf_obsolete_vertex_with_normal_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  int32_t iVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict10 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint n_bytes;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar6;
  
  n_bytes = 4;
  uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar1;
  if (*in_RDI == prf_obsolete_vertex_with_normal_info.opcode) {
    uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar1;
    if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar4 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar4;
      }
      else {
        pvVar4 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar4;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,n_bytes);
        return 0;
      }
    }
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if ((int)(n_bytes + 4) <= (int)(uint)in_RDI[1]) {
      iVar2 = bf_get_int32_be(bfile_00);
      *(int32_t *)bfile_00 = iVar2;
      uVar3 = n_bytes + 4;
      iVar5 = n_bytes + 8;
      n_bytes = uVar3;
      if (iVar5 <= (int)(uint)in_RDI[1]) {
        iVar2 = bf_get_int32_be(bfile_00);
        *(int32_t *)&bfile_00->field_0x4 = iVar2;
        n_bytes = uVar3 + 4;
        if ((int)(uVar3 + 8) <= (int)(uint)in_RDI[1]) {
          iVar2 = bf_get_int32_be(bfile_00);
          *(int32_t *)&bfile_00->file = iVar2;
          n_bytes = n_bytes + 4;
        }
      }
    }
    if ((int)n_bytes < (int)(uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar6 = 1;
  }
  else {
    prf_error(9,"tried vertex with normal (obs) load method for node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,n_bytes);
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

static
bool_t
prf_obsolete_vertex_with_normal_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_obsolete_vertex_with_normal_info.opcode ) {
        prf_error( 9,
            "tried vertex with normal (obs) load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        data->x = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->z = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}